

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

bool __thiscall cmGeneratorTarget::HasSOName(cmGeneratorTarget *this,string *config)

{
  cmMakefile *this_00;
  bool bVar1;
  TargetType TVar2;
  char *pcVar3;
  allocator<char> local_59;
  string local_58;
  string local_38;
  
  TVar2 = GetType(this);
  if (TVar2 == SHARED_LIBRARY) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"NO_SONAME",&local_59);
    bVar1 = GetPropertyAsBool(this,&local_38);
    if (bVar1) {
      bVar1 = false;
    }
    else {
      this_00 = this->Makefile;
      GetLinkerLanguage(&local_58,this,config);
      pcVar3 = cmMakefile::GetSONameFlag(this_00,&local_58);
      bVar1 = pcVar3 != (char *)0x0;
      std::__cxx11::string::~string((string *)&local_58);
    }
    std::__cxx11::string::~string((string *)&local_38);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool cmGeneratorTarget::HasSOName(const std::string& config) const
{
  // soname is supported only for shared libraries and modules,
  // and then only when the platform supports an soname flag.
  return ((this->GetType() == cmStateEnums::SHARED_LIBRARY) &&
          !this->GetPropertyAsBool("NO_SONAME") &&
          this->Makefile->GetSONameFlag(this->GetLinkerLanguage(config)));
}